

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O1

UniquePtr<struct_stack_st_X509_NAME> DecodeHexX509Names(string *hex_names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  void *__s;
  undefined8 extraout_RAX;
  _Head_base<0UL,_X509_name_st_*,_false> p;
  size_t sVar5;
  _Head_base<0UL,_stack_st_X509_NAME_*,_false> _Var6;
  long *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pbVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  uint8_t high;
  UniquePtr<struct_stack_st_X509_NAME> ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  der_names;
  byte local_a9;
  __uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  __uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter> local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Head_base<0UL,_stack_st_X509_NAME_*,_false> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  ulong local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_head_impl = (stack_st_X509_NAME *)hex_names;
  if (in_RSI[1] != 0) {
    uVar8 = 0;
    do {
      if (*(char *)(*in_RSI + uVar8) == ',') {
        std::__cxx11::string::substr((ulong)&local_a0,(ulong)in_RSI);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)in_RSI[1]);
  }
  std::__cxx11::string::substr((ulong)&local_a0,(ulong)in_RSI);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
             &local_a0);
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  pbVar3 = local_78.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_38 = 0;
    pbVar7 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      if ((pbVar7->_M_string_length & 1) == 0) {
        uVar8 = pbVar7->_M_string_length >> 1;
        __s = operator_new__(uVar8);
        memset(__s,0,uVar8);
        bVar9 = pbVar7->_M_string_length < 2;
        if (!bVar9) {
          uVar8 = 0;
          do {
            iVar4 = OPENSSL_fromxdigit((uint8_t *)&local_a8,
                                       (int)(pbVar7->_M_dataplus)._M_p[uVar8 * 2]);
            if ((iVar4 == 0) ||
               (iVar4 = OPENSSL_fromxdigit(&local_a9,(int)(pbVar7->_M_dataplus)._M_p[uVar8 * 2 + 1])
               , iVar4 == 0)) goto LAB_0012648c;
            *(byte *)((long)__s + uVar8) =
                 (char)local_a8._M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl << 4 | local_a9;
            uVar8 = uVar8 + 1;
            bVar10 = uVar8 < pbVar7->_M_string_length >> 1;
            bVar9 = !bVar10;
          } while (bVar10);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&local_a0,0,(char *)local_a0._M_string_length,(ulong)__s);
LAB_0012648c:
        operator_delete__(__s);
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_58,&local_a0);
      }
      else {
        DecodeHexX509Names();
        local_38 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar9) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        if ((local_38 & 1) != 0) goto LAB_001264f5;
        this = &local_58;
        goto LAB_001264f0;
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar3);
  }
  this = &local_78;
LAB_001264f0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
LAB_001264f5:
  local_a0._M_dataplus._M_p = (pointer)OPENSSL_sk_new_null();
  pbVar3 = local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((OPENSSL_STACK *)local_a0._M_dataplus._M_p == (OPENSSL_STACK *)0x0) {
    *(undefined8 *)local_60._M_head_impl = 0;
    _Var6._M_head_impl = local_60._M_head_impl;
  }
  else {
    if (local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pbVar2 = (pointer)(pbVar7->_M_dataplus)._M_p;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar2;
        p._M_head_impl =
             (X509_name_st *)
             d2i_X509_NAME((X509_NAME **)0x0,(uchar **)&local_78,pbVar7->_M_string_length);
        if (((_Head_base<0UL,_X509_name_st_*,_false>)p._M_head_impl ==
             (_Head_base<0UL,_X509_name_st_*,_false>)0x0) ||
           (local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)((long)&(pbVar2->_M_dataplus)._M_p + pbVar7->_M_string_length))) {
          local_a8._M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
               (tuple<X509_name_st_*,_bssl::internal::Deleter>)
               (tuple<X509_name_st_*,_bssl::internal::Deleter>)p._M_head_impl;
          DecodeHexX509Names();
LAB_001265f6:
          _Var6._M_head_impl = local_60._M_head_impl;
          *(undefined8 *)local_60._M_head_impl = 0;
          std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_a8);
          goto LAB_0012660c;
        }
        local_a8._M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
             (tuple<X509_name_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>)0x0;
        local_80._M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
             (tuple<X509_name_st_*,_bssl::internal::Deleter>)
             (tuple<X509_name_st_*,_bssl::internal::Deleter>)p._M_head_impl;
        sVar5 = OPENSSL_sk_push((OPENSSL_STACK *)local_a0._M_dataplus._M_p,p._M_head_impl);
        if (sVar5 == 0) {
          std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_80);
          goto LAB_001265f6;
        }
        local_80._M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
             (tuple<X509_name_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>)0x0;
        std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_80);
        std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_a8);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != pbVar3);
    }
    *(pointer *)local_60._M_head_impl = local_a0._M_dataplus._M_p;
    local_a0._M_dataplus._M_p = (pointer)0x0;
    _Var6._M_head_impl = local_60._M_head_impl;
  }
LAB_0012660c:
  std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return (__uniq_ptr_data<stack_st_X509_NAME,_bssl::internal::Deleter,_true,_true>)
         (tuple<stack_st_X509_NAME_*,_bssl::internal::Deleter>)_Var6._M_head_impl;
}

Assistant:

static bssl::UniquePtr<STACK_OF(X509_NAME)> DecodeHexX509Names(
    const std::string &hex_names) {
  const std::vector<std::string> der_names = DecodeHexStrings(hex_names);
  bssl::UniquePtr<STACK_OF(X509_NAME)> ret(sk_X509_NAME_new_null());
  if (!ret) {
    return nullptr;
  }

  for (const auto &der_name : der_names) {
    const uint8_t *const data =
        reinterpret_cast<const uint8_t *>(der_name.data());
    const uint8_t *derp = data;
    bssl::UniquePtr<X509_NAME> name(
        d2i_X509_NAME(nullptr, &derp, der_name.size()));
    if (!name || derp != data + der_name.size()) {
      fprintf(stderr, "Failed to parse X509_NAME.\n");
      return nullptr;
    }

    if (!bssl::PushToStack(ret.get(), std::move(name))) {
      return nullptr;
    }
  }

  return ret;
}